

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socketio_berkeley.c
# Opt level: O0

void socketio_dowork(CONCRETE_IO_HANDLE socket_io)

{
  int iVar1;
  long *__ptr;
  LOGGER_LOG p_Var2;
  char *pcVar3;
  ssize_t sVar4;
  int *piVar5;
  bool bVar6;
  LOGGER_LOG l_6;
  LOGGER_LOG l_5;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  ssize_t received;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  ssize_t send_result;
  LOGGER_LOG l;
  PENDING_SOCKET_IO *pending_socket_io;
  LIST_ITEM_HANDLE first_pending_io;
  SOCKET_IO_INSTANCE *socket_io_instance;
  CONCRETE_IO_HANDLE socket_io_local;
  
  if (socket_io != (CONCRETE_IO_HANDLE)0x0) {
    signal(0xd,(__sighandler_t)0x1);
    if (*(int *)((long)socket_io + 0x50) == 2) {
      pending_socket_io =
           (PENDING_SOCKET_IO *)
           singlylinkedlist_get_head_item(*(SINGLYLINKEDLIST_HANDLE *)((long)socket_io + 0x58));
      while (pending_socket_io != (PENDING_SOCKET_IO *)0x0) {
        __ptr = (long *)singlylinkedlist_item_get_value((LIST_ITEM_HANDLE)pending_socket_io);
        if (__ptr == (long *)0x0) {
          indicate_error((SOCKET_IO_INSTANCE *)socket_io);
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/deps/c-utility/adapters/socketio_berkeley.c"
                      ,"socketio_dowork",0x410,1,"Failure: retrieving socket from list");
          }
          break;
        }
        sVar4 = send(*socket_io,(void *)*__ptr,__ptr[1],0x4000);
        if ((sVar4 < 0) || (sVar4 != __ptr[1])) {
          if (sVar4 != -1) {
            memmove((void *)*__ptr,(void *)(*__ptr + sVar4),__ptr[1] - sVar4);
            __ptr[1] = __ptr[1] - sVar4;
            break;
          }
          piVar5 = __errno_location();
          if ((*piVar5 == 0xb) || (piVar5 = __errno_location(), *piVar5 == 0x69)) break;
          free((void *)*__ptr);
          free(__ptr);
          singlylinkedlist_remove
                    (*(SINGLYLINKEDLIST_HANDLE *)((long)socket_io + 0x58),
                     (LIST_ITEM_HANDLE)pending_socket_io);
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            piVar5 = __errno_location();
            iVar1 = *piVar5;
            piVar5 = __errno_location();
            pcVar3 = strerror(*piVar5);
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/deps/c-utility/adapters/socketio_berkeley.c"
                      ,"socketio_dowork",0x425,1,
                      "Failure: sending Socket information. errno=%d (%s).",iVar1,pcVar3);
          }
          indicate_error((SOCKET_IO_INSTANCE *)socket_io);
        }
        else {
          if (__ptr[2] != 0) {
            (*(code *)__ptr[2])(__ptr[3],1);
          }
          free((void *)*__ptr);
          free(__ptr);
          iVar1 = singlylinkedlist_remove
                            (*(SINGLYLINKEDLIST_HANDLE *)((long)socket_io + 0x58),
                             (LIST_ITEM_HANDLE)pending_socket_io);
          if (iVar1 != 0) {
            indicate_error((SOCKET_IO_INSTANCE *)socket_io);
            p_Var2 = xlogging_get_log_function();
            if (p_Var2 != (LOGGER_LOG)0x0) {
              (*p_Var2)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/deps/c-utility/adapters/socketio_berkeley.c"
                        ,"socketio_dowork",0x43e,1,"Failure: unable to remove socket from list");
            }
          }
        }
        pending_socket_io =
             (PENDING_SOCKET_IO *)
             singlylinkedlist_get_head_item(*(SINGLYLINKEDLIST_HANDLE *)((long)socket_io + 0x58));
      }
      if (*(int *)((long)socket_io + 0x50) == 2) {
        do {
          sVar4 = recv(*socket_io,(void *)((long)socket_io + 0x60),0x40,0x4000);
          if (sVar4 < 1) {
            if (sVar4 == 0) {
              indicate_error((SOCKET_IO_INSTANCE *)socket_io);
            }
            else if ((sVar4 < 0) && (piVar5 = __errno_location(), *piVar5 != 0xb)) {
              p_Var2 = xlogging_get_log_function();
              if (p_Var2 != (LOGGER_LOG)0x0) {
                piVar5 = __errno_location();
                (*p_Var2)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/deps/c-utility/adapters/socketio_berkeley.c"
                          ,"socketio_dowork",0x45a,1,
                          "Socketio_Failure: Receiving data from endpoint: errno=%d.",*piVar5);
              }
              indicate_error((SOCKET_IO_INSTANCE *)socket_io);
            }
          }
          else if (*(long *)((long)socket_io + 8) != 0) {
            (**(code **)((long)socket_io + 8))
                      (*(undefined8 *)((long)socket_io + 0x20),(long)socket_io + 0x60,sVar4);
          }
          bVar6 = false;
          if (0 < sVar4) {
            bVar6 = *(int *)((long)socket_io + 0x50) == 2;
          }
        } while (bVar6);
      }
    }
    else if (*(int *)((long)socket_io + 0x50) == 1) {
      iVar1 = lookup_address((SOCKET_IO_INSTANCE *)socket_io);
      if (iVar1 == 0) {
        if (*(int *)((long)socket_io + 0x50) == 2) {
          iVar1 = initiate_socket_connection((SOCKET_IO_INSTANCE *)socket_io);
          if (iVar1 == 0) {
            iVar1 = wait_for_socket_connection((SOCKET_IO_INSTANCE *)socket_io);
            if (iVar1 != 0) {
              p_Var2 = xlogging_get_log_function();
              if (p_Var2 != (LOGGER_LOG)0x0) {
                (*p_Var2)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/deps/c-utility/adapters/socketio_berkeley.c"
                          ,"socketio_dowork",0x475,1,
                          "Socketio_Failure: wait_for_socket_connection failed");
              }
              indicate_error((SOCKET_IO_INSTANCE *)socket_io);
            }
          }
          else {
            p_Var2 = xlogging_get_log_function();
            if (p_Var2 != (LOGGER_LOG)0x0) {
              (*p_Var2)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/deps/c-utility/adapters/socketio_berkeley.c"
                        ,"socketio_dowork",0x470,1,
                        "Socketio_Failure: initiate_socket_connection failed");
            }
            indicate_error((SOCKET_IO_INSTANCE *)socket_io);
          }
        }
      }
      else {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/deps/c-utility/adapters/socketio_berkeley.c"
                    ,"socketio_dowork",0x467,1,"Socketio_Failure: lookup address failed");
        }
        indicate_error((SOCKET_IO_INSTANCE *)socket_io);
      }
    }
  }
  return;
}

Assistant:

void socketio_dowork(CONCRETE_IO_HANDLE socket_io)
{
    if (socket_io != NULL)
    {
        SOCKET_IO_INSTANCE* socket_io_instance = (SOCKET_IO_INSTANCE*)socket_io;
        signal(SIGPIPE, SIG_IGN);

        if (socket_io_instance->io_state == IO_STATE_OPEN)
        {
            LIST_ITEM_HANDLE first_pending_io = singlylinkedlist_get_head_item(socket_io_instance->pending_io_list);
            while (first_pending_io != NULL)
            {
                PENDING_SOCKET_IO* pending_socket_io = (PENDING_SOCKET_IO*)singlylinkedlist_item_get_value(first_pending_io);
                if (pending_socket_io == NULL)
                {
                    indicate_error(socket_io_instance);
                    LogError("Failure: retrieving socket from list");
                    break;
                }

                ssize_t send_result = send(socket_io_instance->socket, pending_socket_io->bytes, pending_socket_io->size, MSG_NOSIGNAL);
                if ((send_result < 0) || ((size_t)send_result != pending_socket_io->size))
                {
                    if (send_result == INVALID_SOCKET)
                    {
                        if (errno == EAGAIN  || errno == ENOBUFS) /*send says "come back later" with EAGAIN, ENOBUFS - likely the socket buffer cannot accept more data*/
                        {
                            /*do nothing until next dowork */
                            break;
                        }
                        else
                        {
                            free(pending_socket_io->bytes);
                            free(pending_socket_io);
                            pending_socket_io = NULL;
                            (void)singlylinkedlist_remove(socket_io_instance->pending_io_list, first_pending_io);

                            LogError("Failure: sending Socket information. errno=%d (%s).", errno, strerror(errno));
                            indicate_error(socket_io_instance);
                        }
                    }
                    else
                    {
                        /* simply wait until next dowork */
                        (void)memmove(pending_socket_io->bytes, pending_socket_io->bytes + send_result, pending_socket_io->size - send_result);
                        pending_socket_io->size -= send_result;
                        break;
                    }
                }
                else
                {
                    if (pending_socket_io->on_send_complete != NULL)
                    {
                        pending_socket_io->on_send_complete(pending_socket_io->callback_context, IO_SEND_OK);
                    }

                    free(pending_socket_io->bytes);
                    free(pending_socket_io);
                    pending_socket_io = NULL;
                    if (singlylinkedlist_remove(socket_io_instance->pending_io_list, first_pending_io) != 0)
                    {
                        indicate_error(socket_io_instance);
                        LogError("Failure: unable to remove socket from list");
                    }
                }

                first_pending_io = singlylinkedlist_get_head_item(socket_io_instance->pending_io_list);
            }

             if (socket_io_instance->io_state == IO_STATE_OPEN)
            {
                ssize_t received = 0;
                do
                {
                    received = recv(socket_io_instance->socket, socket_io_instance->recv_bytes, XIO_RECEIVE_BUFFER_SIZE, MSG_NOSIGNAL);
                    if (received > 0)
                    {
                        if (socket_io_instance->on_bytes_received != NULL)
                        {
                            /* Explicitly ignoring here the result of the callback */
                            (void)socket_io_instance->on_bytes_received(socket_io_instance->on_bytes_received_context, socket_io_instance->recv_bytes, received);
                        }
                    }
                    else if (received == 0)
                    {
                        // Do not log error here due to this is probably the socket being closed on the other end
                        indicate_error(socket_io_instance);
                    }
                    else if (received < 0 && errno != EAGAIN)
                    {
                        LogError("Socketio_Failure: Receiving data from endpoint: errno=%d.", errno);
                        indicate_error(socket_io_instance);
                    }

                } while (received > 0 && socket_io_instance->io_state == IO_STATE_OPEN);
            }
        }
        else
        {
            if (socket_io_instance->io_state == IO_STATE_OPENING)
            {
                if(lookup_address(socket_io_instance) != 0)
                {
                    LogError("Socketio_Failure: lookup address failed");
                    indicate_error(socket_io_instance);
                }
                else
                {
                    if(socket_io_instance->io_state == IO_STATE_OPEN)
                    {
                        if (initiate_socket_connection(socket_io_instance) != 0)
                        {
                            LogError("Socketio_Failure: initiate_socket_connection failed");
                            indicate_error(socket_io_instance);
                        }
                        else if (wait_for_socket_connection(socket_io_instance) != 0)
                        {
                            LogError("Socketio_Failure: wait_for_socket_connection failed");
                            indicate_error(socket_io_instance);
                        }
                    }
                }

            }
        }
    }
}